

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbridge.c
# Opt level: O2

entity * e_at(int x,int y)

{
  long lVar1;
  
  lVar1 = 0;
  while( true ) {
    if (lVar1 == 0x30) {
      return (entity *)0x0;
    }
    if (((*(long *)((long)&occupants[0].edata + lVar1) != 0) &&
        (*(int *)((long)&occupants[0].ex + lVar1) == x)) &&
       (*(int *)((long)&occupants[0].ey + lVar1) == y)) break;
    lVar1 = lVar1 + 0x18;
  }
  return (entity *)((long)&occupants[0].emon + lVar1);
}

Assistant:

static struct entity *e_at(int x, int y)
{
	int entitycnt;

	for (entitycnt = 0; entitycnt < ENTITIES; entitycnt++)
		if ((occupants[entitycnt].edata) &&
		    (occupants[entitycnt].ex == x) &&
		    (occupants[entitycnt].ey == y))
			break;
	return((entitycnt == ENTITIES)?
	       NULL : &(occupants[entitycnt]));
}